

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O1

cmPropertyDefinition * __thiscall
cmPropertyDefinitionMap::GetPropertyDefinition
          (cmPropertyDefinitionMap *this,string *name,ScopeType scope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  cmPropertyDefinition *pcVar4;
  key_type local_48;
  
  paVar1 = &local_48.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  local_48.second = scope;
  cVar3 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
          ::find((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
                  *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar4 = (cmPropertyDefinition *)0x0;
  if ((_Rb_tree_header *)cVar3._M_node != &(this->Map_)._M_t._M_impl.super__Rb_tree_header) {
    pcVar4 = (cmPropertyDefinition *)&cVar3._M_node[2]._M_parent;
  }
  return pcVar4;
}

Assistant:

cmPropertyDefinition const* cmPropertyDefinitionMap::GetPropertyDefinition(
  const std::string& name, cmProperty::ScopeType scope) const
{
  auto it = this->Map_.find(KeyType(name, scope));
  if (it != this->Map_.end()) {
    return &it->second;
  }

  return nullptr;
}